

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::alloc
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this,int new_len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CJoystick *pCVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  CJoystick *pCVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar11 [16];
  
  uVar7 = (ulong)(uint)new_len;
  this->list_size = new_len;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)new_len;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x98),8) == 0) {
    uVar4 = SUB168(auVar1 * ZEXT816(0x98),0);
  }
  pCVar3 = (CJoystick *)operator_new__(uVar4);
  auVar2 = _DAT_001d4f30;
  auVar1 = _DAT_001d4390;
  if (new_len != 0) {
    uVar4 = (long)new_len * 0x98 - 0x98;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar4;
    uVar10 = SUB164(auVar15 * ZEXT816(0xd79435e50d79435f),8);
    uVar13 = (undefined4)(uVar4 / 0x130000000);
    auVar11._0_8_ = CONCAT44(uVar13,uVar10);
    auVar11._8_4_ = uVar10;
    auVar11._12_4_ = uVar13;
    auVar12._0_8_ = auVar11._0_8_ >> 7;
    auVar12._8_8_ = auVar11._8_8_ >> 7;
    uVar5 = 0;
    auVar12 = auVar12 ^ _DAT_001d4390;
    pCVar8 = pCVar3;
    do {
      auVar14._8_4_ = (int)uVar5;
      auVar14._0_8_ = uVar5;
      auVar14._12_4_ = (int)(uVar5 >> 0x20);
      auVar15 = (auVar14 | auVar2) ^ auVar1;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        (pCVar8->super_IJoystick)._vptr_IJoystick = (_func_int **)&PTR_GetIndex_00211550;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        pCVar8[1].super_IJoystick._vptr_IJoystick = (_func_int **)&PTR_GetIndex_00211550;
      }
      uVar5 = uVar5 + 2;
      pCVar8 = pCVar8 + 2;
    } while ((uVar4 / 0x98 + 2 & 0xfffffffffffffffe) != uVar5);
  }
  if (this->num_elements < new_len) {
    uVar7 = (ulong)(uint)this->num_elements;
  }
  pCVar8 = this->list;
  iVar6 = (int)uVar7;
  if (iVar6 < 1) {
    if (pCVar8 == (CJoystick *)0x0) goto LAB_0012a31b;
  }
  else {
    lVar9 = 0;
    do {
      memcpy(pCVar3->m_aName + lVar9 + -0xc,pCVar8->m_aName + lVar9 + -0xc,0x90);
      lVar9 = lVar9 + 0x98;
    } while (uVar7 * 0x98 - lVar9 != 0);
  }
  operator_delete__(pCVar8);
  iVar6 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar6 = this->num_elements;
  }
LAB_0012a31b:
  this->num_elements = iVar6;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}